

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * declarator(dmr_C *C,token *token,decl_state *ctx)

{
  byte *pbVar1;
  uchar uVar2;
  _func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *p_Var3;
  global_symbols_t *pgVar4;
  anon_union_136_3_e2189aaa_for_symbol_15 *paVar5;
  decl_state *pdVar6;
  uint uVar7;
  int iVar8;
  symbol *psVar9;
  token *ptVar10;
  char *pcVar11;
  symbol *psVar12;
  position pVar13;
  position *ppVar14;
  dmr_C *C_00;
  decl_state *pdVar15;
  position *ppVar16;
  undefined4 uStack_88;
  undefined4 uStack_84;
  expression *expr;
  undefined4 local_78;
  undefined4 uStack_74;
  uint uStack_70;
  undefined4 uStack_6c;
  symbol *local_68;
  ident **ppiStack_60;
  symbol_op *local_58;
  uchar uStack_50;
  uchar uStack_4f;
  byte bStack_4e;
  uchar uStack_4d;
  undefined4 uStack_4c;
  int local_44;
  position *local_40;
  symbol *local_38;
  
  while( true ) {
    uVar7 = SUB84(token->pos,0) & 0x3f;
    pdVar15 = ctx;
    if (uVar7 != 0x11) break;
    if (*(uint *)((long)token + 0x10) != 0x2a) {
      ppVar14 = (position *)ctx->ident;
      if (*(uint *)((long)token + 0x10) != 0x28) goto LAB_0011612a;
      uVar2 = ctx->prefer_abstract;
      local_40 = (position *)ctx->ident;
      ptVar10 = skip_attributes(C,*(token **)((long)token + 8));
      uVar7 = SUB84(ptVar10->pos,0) & 0x3f;
      if (uVar7 == 0x11) {
        ppVar14 = local_40;
        if (((ptVar10->field_2).special == 0x29) || ((ptVar10->field_2).special == 0x117))
        goto LAB_0011612a;
      }
      else if ((uVar7 == 2) &&
              ((iVar8 = dmrC_lookup_type(ptVar10), iVar8 != 0 && (ppVar14 = local_40, uVar2 != '\0')
               ))) goto LAB_0011612a;
      psVar9 = (ctx->ctype).base_type;
      if (*(token **)((long)token + 8) != ptVar10) {
        ptVar10 = handle_attributes(C,*(token **)((long)token + 8),ctx,8);
      }
      ptVar10 = declarator(C,ptVar10,ctx);
      token = dmrC_expect_token(C,ptVar10,0x29,"in nested declarator");
      ppVar14 = (position *)0x0;
      pdVar6 = ctx;
      do {
        pdVar15 = pdVar6;
        psVar12 = (pdVar15->ctype).base_type;
        pdVar6 = (decl_state *)&(psVar12->field_14).field_2.ctype;
      } while (psVar12 != psVar9);
      goto LAB_0011612a;
    }
    psVar9 = dmrC_alloc_symbol(C->S,token->pos,4);
    (psVar9->field_14).field_2.ctype.modifiers = (ctx->ctype).modifiers;
    (psVar9->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
    *(uint *)((long)&psVar9->field_14 + 0x30) = (ctx->ctype).as;
    (psVar9->field_14).field_2.ctype.contexts = (ctx->ctype).contexts;
    (ctx->ctype).modifiers = 0;
    (ctx->ctype).base_type = psVar9;
    (ctx->ctype).alignment = 0;
    (ctx->ctype).contexts = (context_list *)0x0;
    (ctx->ctype).as = 0;
    token = *(token **)((long)token + 8);
    while ((((*(uint *)token & 0x3f) == 2 &&
            (psVar9 = dmrC_lookup_symbol(*(ident **)((long)token + 0x10),NS_TYPEDEF),
            psVar9 != (symbol *)0x0)) &&
           ((*(char *)psVar9 == '\x11' && ((psVar9->op->type & (KW_ATTRIBUTE|KW_QUALIFIER)) != 0))))
          ) {
      token = *(token **)((long)token + 8);
      p_Var3 = psVar9->op->declarator;
      if (p_Var3 != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
        token = (*p_Var3)(C,token,ctx);
      }
    }
    ((ctx->ctype).base_type)->endpos = token->pos;
  }
  ppVar14 = (position *)ctx->ident;
  if (ppVar14 == (position *)0x0) {
    ppVar14 = (position *)0x0;
  }
  else if (uVar7 == 2) {
    *ppVar14 = *(position *)((long)token + 0x10);
    token = *(token **)((long)token + 8);
  }
LAB_0011612a:
  pVar13 = token->pos;
  if (((pVar13._0_4_ & 0x3f) != 0x11) || (*(uint *)((long)token + 0x10) != 0x28)) {
    while( true ) {
      if ((pVar13._0_4_ & 0x3f) != 0x11) {
        return (token *)(position)token;
      }
      if (*(uint *)((long)token + 0x10) != 0x5b) break;
      psVar9 = alloc_indirect_symbol(C,pVar13,&pdVar15->ctype,6);
      _uStack_88 = (expression *)0x0;
      local_44 = 0;
      C_00 = C;
      ptVar10 = abstract_array_static_declarator(C,*(token **)((long)token + 8),&local_44);
      pgVar4 = C->S;
      iVar8 = match_idents(C_00,ptVar10,pgVar4->restrict_ident,pgVar4->__restrict_ident,
                           pgVar4->__restrict___ident,0);
      if (iVar8 != 0) {
        ptVar10 = abstract_array_static_declarator(C,ptVar10->next,&local_44);
      }
      ptVar10 = dmrC_parse_expression(C,ptVar10,(expression **)&stack0xffffffffffffff78);
      (psVar9->field_14).field_0.used_in = (scope *)_uStack_88;
      token = dmrC_expect_token(C,ptVar10,0x5d,"in abstract_array_declarator");
      psVar9->endpos = token->pos;
      pdVar15 = (decl_state *)&(psVar9->field_14).field_2.ctype;
      pVar13 = token->pos;
    }
    return (token *)(position)token;
  }
  ppVar16 = (position *)((long)token + 8);
  ptVar10 = *(token **)((long)token + 8);
  uVar7 = SUB84(ptVar10->pos,0) & 0x3f;
  if (uVar7 == 0x11) {
    if ((ptVar10->field_2).special == 0x117) {
      dmrC_warning(C,ptVar10->pos,"variadic functions must have one named argument");
LAB_00116429:
      local_38 = alloc_indirect_symbol(C,token->pos,&pdVar15->ctype,5);
      local_40 = (position *)((long)&local_38->field_14 + 0x40);
      do {
        pVar13 = *ppVar16;
        if (((SUB84(*(position *)pVar13,0) & 0x3f) == 0x11) &&
           (*(int *)((long)pVar13 + 0x10) == 0x117)) {
          pbVar1 = (byte *)((long)&local_38->field_14 + 0xe);
          *pbVar1 = *pbVar1 | 4;
          ppVar16 = (position *)((long)pVar13 + 8);
          psVar9 = local_38;
          goto LAB_00116365;
        }
        psVar12 = dmrC_alloc_symbol(C->S,*(position *)pVar13,3);
        local_58 = (symbol_op *)0x0;
        local_68 = (symbol *)0x0;
        ppiStack_60 = (ident **)0x0;
        _local_78 = (context_list *)0x0;
        uStack_70 = 0;
        uStack_6c = 0;
        _uStack_88 = (expression *)0x0;
        expr = (expression *)0x0;
        uStack_50 = '\x01';
        uStack_4f = '\0';
        bStack_4e = '\0';
        uStack_4d = '\0';
        uStack_4c = 0;
        ptVar10 = declaration_specifiers(C,(token *)pVar13,(decl_state *)&stack0xffffffffffffff78);
        ppiStack_60 = &psVar12->ident;
        ptVar10 = declarator(C,ptVar10,(decl_state *)&stack0xffffffffffffff78);
        pVar13 = (position)handle_attributes(C,ptVar10,(decl_state *)&stack0xffffffffffffff78,8);
        apply_modifiers(C,*(position *)pVar13,(decl_state *)&stack0xffffffffffffff78);
        (psVar12->field_14).field_2.ctype.base_type = local_68;
        *(undefined4 *)((long)&psVar12->field_14 + 0x28) = local_78;
        *(undefined4 *)((long)&psVar12->field_14 + 0x2c) = uStack_74;
        *(uint *)((long)&psVar12->field_14 + 0x30) = uStack_70;
        *(undefined4 *)((long)&psVar12->field_14 + 0x34) = uStack_6c;
        *(undefined4 *)((long)&psVar12->field_14 + 0x18) = uStack_88;
        *(undefined4 *)((long)&psVar12->field_14 + 0x1c) = uStack_84;
        *(undefined4 *)((long)&psVar12->field_14 + 0x20) = expr._0_4_;
        *(undefined4 *)((long)&psVar12->field_14 + 0x24) = expr._4_4_;
        (psVar12->field_14).field_2.ctype.modifiers =
             (ulong)(uStack_4f != '\0') << 0x12 |
             *(ulong *)(storage_modifiers_mod + (ulong)bStack_4e * 8) |
             (psVar12->field_14).field_2.ctype.modifiers | (ulong)(uStack_4d != '\0') << 0x11;
        psVar12->endpos = *(position *)pVar13;
        *(uint *)((long)&psVar12->field_14 + 0xc) =
             *(uint *)((long)&psVar12->field_14 + 0xc) & 0xfdffffff | (uint)(bStack_4e == 6) << 0x19
        ;
        if ((psVar12->field_14).field_2.ctype.base_type == &C->S->void_ctype) {
          if ((*local_40 == (position)0x0) && (psVar9 = local_38, psVar12->ident == (ident *)0x0))
          goto LAB_00116368;
          dmrC_warning(C,*(position *)pVar13,"void parameter");
        }
        ptrlist_add((ptr_list **)local_40,psVar12,&C->ptrlist_allocator);
        psVar9 = local_38;
        if (((*(uint *)pVar13 & 0x3f) != 0x11) || (*(int *)((long)pVar13 + 0x10) != 0x2c))
        goto LAB_00116368;
        ppVar16 = (position *)((long)pVar13 + 8);
      } while( true );
    }
    if ((((ptVar10->field_2).special == 0x29) && (ppVar14 != (position *)0x0)) &&
       ((((ulong)ptVar10->next->pos & 0x3f) != 0x11 || ((ptVar10->next->field_2).special != 0x3b))))
    {
      pcVar11 = dmrC_show_ident(C,(ident *)*ppVar14);
      dmrC_warning(C,ptVar10->pos,"non-ANSI function declaration of function \'%s\'",pcVar11);
      pVar13 = token->pos;
    }
  }
  else if (uVar7 == 2) {
    uVar2 = ctx->prefer_abstract;
    iVar8 = dmrC_lookup_type(ptVar10);
    if (iVar8 != 0) goto LAB_00116429;
    if (uVar2 != '\0') {
      dmrC_warning(C,token->pos,"identifier list not in definition");
    }
    local_38 = alloc_indirect_symbol(C,token->pos,&pdVar15->ctype,5);
    paVar5 = &local_38->field_14;
    do {
      pVar13 = *ppVar16;
      psVar9 = dmrC_alloc_symbol(C->S,*(position *)pVar13,3);
      psVar9->ident = (ident *)*(position *)((long)pVar13 + 0x10);
      pVar13 = *(position *)((long)pVar13 + 8);
      psVar9->endpos = *(position *)pVar13;
      (psVar9->field_14).field_2.ctype.base_type = &C->S->incomplete_ctype;
      ptrlist_add((ptr_list **)&(paVar5->field_2).arguments,psVar9,&C->ptrlist_allocator);
      psVar9 = local_38;
      if ((((*(uint *)pVar13 & 0x3f) != 0x11) || (*(uint *)((long)pVar13 + 0x10) != 0x2c)) ||
         (((ulong)(*(token **)((long)pVar13 + 8))->pos & 0x3f) != 2)) break;
      ppVar16 = (position *)((long)pVar13 + 8);
      iVar8 = dmrC_lookup_type(*(token **)((long)pVar13 + 8));
      psVar9 = local_38;
    } while (iVar8 == 0);
    goto LAB_00116368;
  }
  psVar9 = alloc_indirect_symbol(C,pVar13,&pdVar15->ctype,5);
LAB_00116365:
  pVar13 = *ppVar16;
LAB_00116368:
  ptVar10 = dmrC_expect_token(C,(token *)pVar13,0x29,"in function declarator");
  psVar9->endpos = ptVar10->pos;
  return ptVar10;
}

Assistant:

static struct token *declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	token = pointer(C, token, ctx);
	return direct_declarator(C, token, ctx);
}